

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BMPattern.cpp
# Opt level: O1

void __thiscall xercesc_4_0::BMPattern::initialize(BMPattern *this)

{
  short *psVar1;
  bool bVar2;
  XMLSize_t *pXVar3;
  ulong uVar4;
  int iVar5;
  undefined4 extraout_var;
  XMLCh *pXVar6;
  XMLCh *pXVar7;
  XMLCh *pXVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  ulong uVar13;
  ArrayJanitor<char16_t> janLowercase;
  ArrayJanitor<char16_t> AStack_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  uVar13 = 0;
  if (this->fPattern != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fPattern + uVar13);
      uVar13 = uVar13 + 2;
    } while (*psVar1 != 0);
    uVar13 = ((long)uVar13 >> 1) - 1;
  }
  iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                    (this->fMemoryManager,(ulong)this->fShiftTableLen << 3);
  this->fShiftTable = (XMLSize_t *)CONCAT44(extraout_var,iVar5);
  if (this->fIgnoreCase == true) {
    pXVar7 = this->fPattern;
    if (pXVar7 == (XMLCh *)0x0) {
      pXVar6 = (XMLCh *)0x0;
    }
    else {
      sVar12 = 0;
      do {
        psVar1 = (short *)((long)pXVar7 + sVar12);
        sVar12 = sVar12 + 2;
      } while (*psVar1 != 0);
      iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar12);
      pXVar6 = (XMLCh *)CONCAT44(extraout_var_00,iVar5);
      memcpy(pXVar6,pXVar7,sVar12);
    }
    this->fUppercasePattern = pXVar6;
    pXVar6 = this->fPattern;
    if (pXVar6 == (XMLCh *)0x0) {
      pXVar7 = (XMLCh *)0x0;
    }
    else {
      sVar12 = 0;
      do {
        psVar1 = (short *)((long)pXVar6 + sVar12);
        sVar12 = sVar12 + 2;
      } while (*psVar1 != 0);
      iVar5 = (*this->fMemoryManager->_vptr_MemoryManager[3])(this->fMemoryManager,sVar12);
      pXVar7 = (XMLCh *)CONCAT44(extraout_var_01,iVar5);
      memcpy(pXVar7,pXVar6,sVar12);
    }
    XMLString::upperCase(this->fUppercasePattern);
    XMLString::lowerCase(pXVar7);
  }
  else {
    pXVar7 = (char16_t *)0x0;
  }
  ArrayJanitor<char16_t>::ArrayJanitor(&AStack_38,pXVar7,this->fMemoryManager);
  uVar9 = (ulong)this->fShiftTableLen;
  if (uVar9 != 0) {
    pXVar3 = this->fShiftTable;
    uVar10 = 0;
    do {
      pXVar3[uVar10] = uVar13;
      uVar10 = uVar10 + 1;
    } while (uVar9 != uVar10);
  }
  if (uVar13 != 0) {
    pXVar6 = this->fPattern;
    pXVar3 = this->fShiftTable;
    bVar2 = this->fIgnoreCase;
    uVar10 = 0;
    do {
      uVar11 = ~uVar10 + uVar13;
      uVar4 = (ulong)(ushort)pXVar6[uVar10] % uVar9;
      if (uVar11 < pXVar3[uVar4]) {
        pXVar3[uVar4] = uVar11;
      }
      if (bVar2 != false) {
        iVar5 = 1;
        do {
          pXVar8 = pXVar7;
          if (iVar5 == 1) {
            pXVar8 = this->fUppercasePattern;
          }
          if (uVar11 < pXVar3[(ulong)(ushort)pXVar8[uVar10] % uVar9]) {
            pXVar3[(ulong)(ushort)pXVar8[uVar10] % uVar9] = uVar11;
          }
          iVar5 = iVar5 + -1;
        } while (iVar5 == 0);
      }
      uVar10 = (ulong)((int)uVar10 + 1);
    } while (uVar10 < uVar13);
  }
  ArrayJanitor<char16_t>::~ArrayJanitor(&AStack_38);
  return;
}

Assistant:

void BMPattern::initialize() {

    const XMLSize_t patternLen = XMLString::stringLen(fPattern);
    XMLCh* lowercasePattern = 0;

    fShiftTable = (XMLSize_t*) fMemoryManager->allocate(fShiftTableLen*sizeof(XMLSize_t)); //new XMLSize_t[fShiftTableLen];

    if (fIgnoreCase) {

        fUppercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        lowercasePattern = XMLString::replicate(fPattern, fMemoryManager);
        XMLString::upperCase(fUppercasePattern);
        XMLString::lowerCase(lowercasePattern);
    }

    ArrayJanitor<XMLCh> janLowercase(lowercasePattern, fMemoryManager);

    for (unsigned int i=0; i< fShiftTableLen; i++)
        fShiftTable[i] = patternLen;

    for (unsigned int k=0; k< patternLen; k++) {

        XMLCh      ch = fPattern[k];
        XMLSize_t diff = patternLen - k - 1;
        int          index = ch % fShiftTableLen;

        if (diff < fShiftTable[index])
            fShiftTable[index] = diff;

        if (fIgnoreCase) {

            for (int j=0; j< 2; j++) {

                ch = (j == 0) ? fUppercasePattern[k] : lowercasePattern[k];
                index = ch % fShiftTableLen;

                if (diff < fShiftTable[index])
                    fShiftTable[index] = diff;
            }
        }
    }
}